

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveWriter.cpp
# Opt level: O0

EStatusCode __thiscall
CFFPrimitiveWriter::Write(CFFPrimitiveWriter *this,Byte *inBuffer,LongBufferSizeType inBufferSize)

{
  int iVar1;
  undefined4 extraout_var;
  EStatusCode status;
  LongBufferSizeType inBufferSize_local;
  Byte *inBuffer_local;
  CFFPrimitiveWriter *this_local;
  
  if (this->mInternalState == eFailure) {
    this_local._4_4_ = eFailure;
  }
  else {
    iVar1 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,inBuffer,inBufferSize);
    this_local._4_4_ = eFailure;
    if (CONCAT44(extraout_var,iVar1) == inBufferSize) {
      this_local._4_4_ = eSuccess;
    }
    if (this_local._4_4_ == eFailure) {
      this->mInternalState = eFailure;
    }
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode CFFPrimitiveWriter::Write(const Byte* inBuffer,LongBufferSizeType inBufferSize)
{
	if(PDFHummus::eFailure == mInternalState)
		return PDFHummus::eFailure;
    
	EStatusCode status = (mCFFOutput->Write(inBuffer,inBufferSize) == inBufferSize ? PDFHummus::eSuccess : PDFHummus::eFailure);
    
	if(PDFHummus::eFailure == status)
		mInternalState = PDFHummus::eFailure;
	return status;
}